

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_str_init_default(nk_str *str)

{
  nk_handle local_28;
  nk_allocator alloc;
  nk_str *str_local;
  
  local_28.ptr = (void *)0x0;
  alloc.userdata.ptr = nk_malloc;
  alloc.alloc = nk_mfree;
  alloc.free = (nk_plugin_free)str;
  nk_buffer_init(&str->buffer,(nk_allocator *)&local_28,0x20);
  *(undefined4 *)(alloc.free + 0x78) = 0;
  return;
}

Assistant:

NK_API void
nk_str_init_default(struct nk_str *str)
{
    struct nk_allocator alloc;
    alloc.userdata.ptr = 0;
    alloc.alloc = nk_malloc;
    alloc.free = nk_mfree;
    nk_buffer_init(&str->buffer, &alloc, 32);
    str->len = 0;
}